

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGFreeTypeLibrary(void *payload,xmlChar *namespace)

{
  xmlRelaxNGTypeLibraryPtr lib;
  xmlChar *namespace_local;
  void *payload_local;
  
  if (payload != (void *)0x0) {
    if (*payload != 0) {
      (*xmlFree)(*payload);
    }
    (*xmlFree)(payload);
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeTypeLibrary(void *payload,
                          const xmlChar * namespace ATTRIBUTE_UNUSED)
{
    xmlRelaxNGTypeLibraryPtr lib = (xmlRelaxNGTypeLibraryPtr) payload;
    if (lib == NULL)
        return;
    if (lib->namespace != NULL)
        xmlFree((xmlChar *) lib->namespace);
    xmlFree(lib);
}